

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O2

void __thiscall
mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,ExprCounter>::
ReadInitialValues<mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,ExprCounter>::AlgebraicConHandler>
          (NLReader<mp::internal::TextReader<fmt::Locale>,ExprCounter> *this)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  
  iVar1 = TextReader<fmt::Locale>::ReadUInt<int>(*(TextReader<fmt::Locale> **)this);
  if (*(int *)(*(long *)(this + 8) + 4) < iVar1) {
    TextReader<fmt::Locale>::ReportError<>(*(TextReader<fmt::Locale> **)this,(CStringRef)0x12d06b);
  }
  TextReader<fmt::Locale>::ReadTillEndOfLine(*(TextReader<fmt::Locale> **)this);
  iVar2 = 0;
  if (0 < iVar1) {
    iVar2 = iVar1;
  }
  while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
    NLReader<mp::internal::TextReader<fmt::Locale>,_ExprCounter>::ReadUInt
              ((NLReader<mp::internal::TextReader<fmt::Locale>,_ExprCounter> *)this,
               *(uint *)(*(long *)(this + 8) + 4));
    TextReader<fmt::Locale>::ReadDouble(*(TextReader<fmt::Locale> **)this);
    TextReader<fmt::Locale>::ReadTillEndOfLine(*(TextReader<fmt::Locale> **)this);
  }
  return;
}

Assistant:

void NLReader<Reader, Handler>::ReadInitialValues() {
  int num_values = reader_.ReadUInt();
  ValueHandler vh(*this);
  if (num_values > vh.num_items())
    reader_.ReportError("too many initial values");
  reader_.ReadTillEndOfLine();
  for (int i = 0; i < num_values; ++i) {
    int index = ReadUInt(vh.num_items());
    vh.SetInitialValue(index, reader_.ReadDouble());
    reader_.ReadTillEndOfLine();
  }
}